

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

int GetRandomValue(int min,int max)

{
  uint32_t uVar1;
  int iVar2;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar3;
  
  iVar6 = max;
  if (min < max) {
    iVar6 = min;
  }
  uVar1 = rprand_xoshiro();
  lVar4 = (long)min - (long)max;
  lVar3 = -lVar4;
  if (0 < lVar4) {
    lVar3 = lVar4;
  }
  iVar2 = (int)lVar3;
  iVar5 = -iVar2;
  if (0 < iVar2) {
    iVar5 = iVar2;
  }
  return iVar6 + uVar1 % (iVar5 + 1U);
}

Assistant:

int GetRandomValue(int min, int max)
{
    int value = 0;

    if (min > max)
    {
        int tmp = max;
        max = min;
        min = tmp;
    }

#if defined(SUPPORT_RPRAND_GENERATOR)
    value = rprand_get_value(min, max);
#else
    // WARNING: Ranges higher than RAND_MAX will return invalid results
    // More specifically, if (max - min) > INT_MAX there will be an overflow,
    // and otherwise if (max - min) > RAND_MAX the random value will incorrectly never exceed a certain threshold
    // NOTE: Depending on the library it can be as low as 32767
    if ((unsigned int)(max - min) > (unsigned int)RAND_MAX)
    {
        TRACELOG(LOG_WARNING, "Invalid GetRandomValue() arguments, range should not be higher than %i", RAND_MAX);
    }

    value = (rand()%(abs(max - min) + 1) + min);
#endif
    return value;
}